

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void __thiscall phosg::InverseTerminalGuard::~InverseTerminalGuard(InverseTerminalGuard *this)

{
  char *__args;
  size_type __args_1;
  undefined1 local_30 [8];
  string e;
  InverseTerminalGuard *this_local;
  
  e.field_2._8_8_ = this;
  if ((this->active & 1U) != 0) {
    format_color_escape_abi_cxx11_((string *)local_30,NORMAL,0xffffffff);
    __args = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_30);
    __args_1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
              (&this->write_data,__args,__args_1);
    ::std::__cxx11::string::~string((string *)local_30);
  }
  ::std::function<void_(const_void_*,_unsigned_long)>::~function(&this->write_data);
  return;
}

Assistant:

~InverseTerminalGuard() {
    if (this->active) {
      string e = format_color_escape(TerminalFormat::NORMAL, TerminalFormat::END);
      this->write_data(e.data(), e.size());
    }
  }